

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

int sam_hdr_update(SAM_hdr *hdr,SAM_hdr_type *type,...)

{
  void *pvVar1;
  size_t sVar2;
  char in_AL;
  int iVar3;
  void **ppvVar4;
  SAM_hdr_tag *pSVar5;
  char *pcVar6;
  uint uVar7;
  undefined8 in_RCX;
  ulong uVar8;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar9;
  SAM_hdr_tag *pSVar10;
  SAM_hdr_tag *pSVar11;
  char cVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_100 = &ap[0].overflow_arg_area;
  uVar7 = 0x10;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    uVar8 = (ulong)uVar7;
    if (uVar8 < 0x29) {
      uVar7 = uVar7 + 8;
      ppvVar4 = (void **)((long)local_e8 + uVar8);
    }
    else {
      ppvVar4 = local_100;
      local_100 = local_100 + 1;
    }
    pcVar6 = (char *)*ppvVar4;
    if (pcVar6 == (char *)0x0) {
      cVar12 = '\x02';
    }
    else {
      uVar8 = (ulong)uVar7;
      if (uVar8 < 0x29) {
        uVar7 = uVar7 + 8;
        ppvVar4 = (void **)((long)local_e8 + uVar8);
      }
      else {
        ppvVar4 = local_100;
        local_100 = local_100 + 1;
      }
      pvVar1 = *ppvVar4;
      pSVar5 = type->tag;
      if (pSVar5 == (SAM_hdr_tag *)0x0) {
        pSVar10 = (SAM_hdr_tag *)0x0;
      }
      else {
        pSVar11 = (SAM_hdr_tag *)0x0;
        do {
          pSVar10 = pSVar5;
          if ((*pSVar10->str == *pcVar6) && (pSVar5 = pSVar10, pSVar10->str[1] == pcVar6[1]))
          goto LAB_0013a747;
          pSVar5 = pSVar10->next;
          pSVar11 = pSVar10;
        } while (pSVar10->next != (SAM_hdr_tag_s *)0x0);
      }
      pSVar5 = (SAM_hdr_tag *)0x0;
      pSVar11 = pSVar10;
LAB_0013a747:
      if (pSVar5 == (SAM_hdr_tag *)0x0) {
        pSVar5 = (SAM_hdr_tag *)pool_alloc(hdr->tag_pool);
        if (pSVar5 != (SAM_hdr_tag *)0x0) {
          if (pSVar11 == (SAM_hdr_tag *)0x0) {
            pSVar11 = (SAM_hdr_tag *)&type->tag;
          }
          pSVar11->next = pSVar5;
          pSVar5->next = (SAM_hdr_tag_s *)0x0;
          goto LAB_0013a76f;
        }
      }
      else {
LAB_0013a76f:
        sVar2 = (hdr->text).l;
        iVar3 = ksprintf(&hdr->text,"%2.2s:%s",pcVar6,pvVar1);
        if (-1 < iVar3) {
          iVar9 = (int)sVar2;
          iVar3 = (int)(hdr->text).l - iVar9;
          pSVar5->len = iVar3;
          pcVar6 = string_ndup(hdr->str_pool,(hdr->text).s + iVar9,(long)iVar3);
          pSVar5->str = pcVar6;
          cVar12 = pcVar6 == (char *)0x0;
          goto LAB_0013a7bd;
        }
      }
      cVar12 = '\x01';
    }
LAB_0013a7bd:
    if (cVar12 != '\0') {
      if (cVar12 == '\x02') {
        iVar3 = 0;
      }
      else {
        iVar3 = -1;
      }
      return iVar3;
    }
  } while( true );
}

Assistant:

int sam_hdr_update(SAM_hdr *hdr, SAM_hdr_type *type, ...) {
    va_list ap;

    va_start(ap, type);
    
    for (;;) {
	char *k, *v;
	int idx;
	SAM_hdr_tag *tag, *prev;

	if (!(k = (char *)va_arg(ap, char *)))
	    break;
	v = va_arg(ap, char *);

	tag = sam_hdr_find_key(hdr, type, k, &prev);
	if (!tag) {
	    if (!(tag = pool_alloc(hdr->tag_pool)))
		return -1;
	    if (prev)
		prev->next = tag;
	    else
		type->tag = tag;

	    tag->next = NULL;
	}

	idx = ks_len(&hdr->text);
	if (ksprintf(&hdr->text, "%2.2s:%s", k, v) < 0)
	    return -1;
	tag->len = ks_len(&hdr->text) - idx;
	tag->str = string_ndup(hdr->str_pool,
			       ks_str(&hdr->text) + idx,
			       tag->len);
	if (!tag->str)
	    return -1;
    }

    va_end(ap);

    return 0;
}